

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int get_path_component(char *name,size_t n,char *fn)

{
  char *pcVar1;
  ulong __n;
  
  pcVar1 = strchr((char *)n,0x2f);
  if (pcVar1 == (char *)0x0) {
    __n = strlen((char *)n);
    if (__n == 0) {
      __n = 0;
      goto LAB_003b3992;
    }
  }
  else {
    __n = (long)pcVar1 - n;
  }
  if (__n < 0x100) {
    memcpy(name,(void *)n,__n);
    name[__n] = '\0';
  }
  else {
    __n = 0xffffffffffffffff;
  }
LAB_003b3992:
  return (int)__n;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}